

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install.cpp
# Opt level: O2

unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
__thiscall
duckdb::InstallFromHttpUrl
          (duckdb *this,DatabaseInstance *db,string *url,string *extension_name,string *temp_path,
          string *param_5,ExtensionInstallOptions *options,
          optional_ptr<duckdb::HTTPLogger,_true> http_logger)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4;
  _Head_base<0UL,_duckdb_httplib::ClientImpl_*,_false> _Var1;
  unique_ptr<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_> uVar2;
  Error EVar3;
  _Alloc_hider __p;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  pointer pFVar8;
  type pFVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  pointer pEVar11;
  __uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_> _Var12;
  ulong uVar13;
  HTTPException *this_00;
  IOException *this_01;
  Error error;
  ulong uVar14;
  string *psVar15;
  string *__a;
  double dVar16;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  undefined1 auStack_448 [16];
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
  install_info;
  _Head_base<0UL,_duckdb_httplib::ClientImpl_*,_false> local_430;
  undefined1 local_421 [9];
  string documentation_link;
  string local_3f0;
  string no_http;
  optional_ptr<duckdb::HTTPLogger,_true> http_logger_local;
  Result res;
  ExtensionInstallInfo info;
  string decompressed_body;
  _Any_data local_270;
  code *local_260;
  code *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> url_base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> url_local_part;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hostname_without_http;
  string local_1f0 [32];
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70 [32];
  string local_50 [32];
  
  http_logger_local = http_logger;
  __a = temp_path;
  local_421._1_8_ = extension_name;
  ::std::__cxx11::string::string((string *)&local_b0,(string *)url);
  ::std::__cxx11::string::string((string *)&info,"http://",(allocator *)&decompressed_body);
  ::std::__cxx11::string::string
            ((string *)&res,anon_var_dwarf_4b71df5 + 9,(allocator *)&hostname_without_http);
  StringUtil::Replace(&no_http,&local_b0,(string *)&info,(string *)&res);
  ::std::__cxx11::string::~string((string *)&res);
  ::std::__cxx11::string::~string((string *)&info);
  ::std::__cxx11::string::~string((string *)&local_b0);
  lVar7 = ::std::__cxx11::string::find((char)&no_http,0x2f);
  if (lVar7 == -1) {
    this_01 = (IOException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&info,"No slash in URL template",(allocator *)&res);
    IOException::IOException(this_01,(string *)&info);
    __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::substr((ulong)&hostname_without_http,(ulong)&no_http);
  ::std::__cxx11::string::substr((ulong)&url_local_part,(ulong)&no_http);
  install_info.
  super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
       )(__uniq_ptr_data<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true,_true>
         )0x0;
  FileSystem::CreateLocal();
  pFVar8 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator->
                     ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                       *)&res);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                   param_5,".info");
  iVar5 = (*pFVar8->_vptr_FileSystem[0x12])(pFVar8,&info,0);
  ::std::__cxx11::string::~string((string *)&info);
  if ((char)iVar5 != '\0') {
    pFVar9 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator*((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                        *)&res);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                     param_5,".info");
    ExtensionInstallInfo::TryReadInfoFile
              ((ExtensionInstallInfo *)&decompressed_body,pFVar9,(string *)&info,
               (string *)local_421._1_8_);
    __p = decompressed_body._M_dataplus;
    decompressed_body._M_dataplus._M_p = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
    ::reset((__uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
             *)&install_info,(pointer)__p._M_p);
    ::std::
    unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>::
    ~unique_ptr((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                 *)&decompressed_body);
    ::std::__cxx11::string::~string((string *)&info);
  }
  if ((__uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>)
      res.res_._M_t.
      super___uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
      .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>)0x0
     ) {
    (**(code **)(*(long *)res.res_._M_t.
                          super___uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
                          .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>._M_head_impl + 8
                ))();
  }
  ::std::operator+(&url_base,"http://",&hostname_without_http);
  res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_header;
  res.res_._M_t.
  super___uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
  .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>,_true,_true>
        )(__uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>)
         0x0;
  res.err_ = Unknown;
  res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar14 = 0;
  res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    ::std::__cxx11::string::string
              ((string *)&info,url_base._M_dataplus._M_p,(allocator *)&decompressed_body);
    duckdb_httplib::Client::Client((Client *)&local_430,(string *)&info);
    ::std::__cxx11::string::~string((string *)&info);
    if ((db->config).options.http_proxy._M_string_length != 0) {
      info._0_8_ = &info.full_path._M_string_length;
      info.full_path._M_dataplus._M_p = (pointer)0x0;
      info.full_path._M_string_length = info.full_path._M_string_length & 0xffffffffffffff00;
      HTTPUtil::ParseHTTPProxyHost
                ((HTTPUtil *)&(db->config).options.http_proxy,(string *)&info,&decompressed_body,
                 (idx_t *)0x50,(idx_t)__a);
      iVar5 = NumericCastImpl<int,_unsigned_long,_false>::Convert
                        ((unsigned_long)decompressed_body._M_dataplus._M_p);
      _Var1._M_head_impl = local_430._M_head_impl;
      ::std::__cxx11::string::_M_assign((string *)&(local_430._M_head_impl)->proxy_host_);
      (_Var1._M_head_impl)->proxy_port_ = iVar5;
      ::std::__cxx11::string::~string((string *)&info);
    }
    if ((db->config).options.http_proxy_password._M_string_length != 0 ||
        (db->config).options.http_proxy_username._M_string_length != 0) {
      duckdb_httplib::ClientImpl::set_proxy_basic_auth
                (local_430._M_head_impl,&(db->config).options.http_proxy_username,
                 &(db->config).options.http_proxy_password);
    }
    if (http_logger_local.ptr != (HTTPLogger *)0x0) {
      local_270._M_unused._M_object =
           optional_ptr<duckdb::HTTPLogger,_true>::operator->(&http_logger_local);
      local_270._8_8_ = 0;
      local_258 = ::std::
                  _Function_handler<void_(const_duckdb_httplib::Request_&,_const_duckdb_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/logging/http_logger.hpp:35:10)>
                  ::_M_invoke;
      local_260 = ::std::
                  _Function_handler<void_(const_duckdb_httplib::Request_&,_const_duckdb_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/logging/http_logger.hpp:35:10)>
                  ::_M_manager;
      duckdb_httplib::Client::set_logger((Client *)&local_430,(Logger *)&local_270);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_270);
    }
    ::std::__cxx11::string::string(local_50,"%s %s",(allocator *)&local_3f0);
    DBConfig::UserAgent_abi_cxx11_(&local_1d0,&db->config);
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              DuckDB::SourceID();
    StringUtil::Format<std::__cxx11::string,char_const*>
              (&documentation_link,(StringUtil *)local_50,&local_1d0,pbVar10,(char *)__a);
    ::std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&info,(char (*) [11])"User-Agent",&documentation_link);
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (auStack_448 + 0xf);
    __a = (string *)local_421;
    __l._M_len = 1;
    __l._M_array = (iterator)&info;
    ::std::
    multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&decompressed_body,__l,(ci *)pbVar10,(allocator_type *)__a);
    ::std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&info);
    ::std::__cxx11::string::~string((string *)&documentation_link);
    ::std::__cxx11::string::~string((string *)&local_1d0);
    ::std::__cxx11::string::~string(local_50);
    if (((options->use_etags == true) &&
        (install_info.
         super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
         .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl !=
         (__uniq_ptr_data<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true,_true>
          )0x0)) &&
       (pEVar11 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                  ::operator->(&install_info), (pEVar11->etag)._M_string_length != 0)) {
      ::std::__cxx11::string::string(local_1f0,"%s",(allocator *)&local_3f0);
      pEVar11 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                ::operator->(&install_info);
      ::std::__cxx11::string::string((string *)&local_d0,(string *)&pEVar11->etag);
      StringUtil::Format<std::__cxx11::string>
                (&documentation_link,(StringUtil *)local_1f0,&local_d0,pbVar10);
      ::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&info,(char (*) [14])"If-None-Match",&documentation_link);
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,duckdb_httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_insert_equal<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,duckdb_httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&decompressed_body,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&info);
      ::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&info);
      ::std::__cxx11::string::~string((string *)&documentation_link);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::__cxx11::string::~string(local_1f0);
    }
    ::std::__cxx11::string::string
              ((string *)&documentation_link,url_local_part._M_dataplus._M_p,(allocator *)&local_3f0
              );
    duckdb_httplib::ClientImpl::Get
              ((Result *)&info,local_430._M_head_impl,&documentation_link,
               (Headers *)&decompressed_body);
    duckdb_httplib::Result::operator=(&res,(Result *)&info);
    duckdb_httplib::Result::~Result((Result *)&info);
    ::std::__cxx11::string::~string((string *)&documentation_link);
    if (install_info.
        super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
        .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl ==
        (__uniq_ptr_data<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true,_true>
         )0x0) {
      if ((__uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>
          )res.res_._M_t.
           super___uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
           .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>
          )0x0) goto LAB_0040f466;
LAB_0040f454:
      _Var12._M_t.
      super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
      .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>._M_head_impl =
           (tuple<duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>)
           (tuple<duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>)
           res.res_;
      if (*(int *)((long)res.res_._M_t.
                         super___uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
                         .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>._M_head_impl +
                  0x20) == 200) {
        iVar5 = 3;
        goto LAB_0040f502;
      }
LAB_0040f468:
      if (res.err_ == Success) {
        uVar6 = *(int *)((long)_Var12._M_t.
                               super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
                               .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>.
                               _M_head_impl + 0x20) - 0x198;
        if (((0x15 < uVar6) || ((0x200401U >> (uVar6 & 0x1f) & 1) == 0)) &&
           ((uVar6 = *(int *)((long)_Var12._M_t.
                                    super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
                                    .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>.
                                    _M_head_impl + 0x20) - 500, 4 < uVar6 ||
            ((0x19U >> (uVar6 & 0x1f) & 1) == 0)))) goto LAB_0040f799;
      }
      if (1 < uVar14) {
LAB_0040f799:
        info._0_8_ = &info.full_path._M_string_length;
        info.full_path._M_dataplus._M_p = (pointer)0x0;
        info.full_path._M_string_length = info.full_path._M_string_length & 0xffffffffffffff00;
        ExtensionHelper::CreateSuggestions((string *)local_421._1_8_,(string *)&info);
        ExtensionHelper::ExtensionInstallDocumentationLink
                  (&documentation_link,(string *)local_421._1_8_);
        if (documentation_link._M_string_length != 0) {
          ::std::operator+(&local_3f0,"\nFor more info, visit ",&documentation_link);
          ::std::__cxx11::string::append((string *)&info);
          ::std::__cxx11::string::~string((string *)&local_3f0);
        }
        EVar3 = res.err_;
        this_00 = (HTTPException *)__cxa_allocate_exception(0x10);
        uVar2 = res.res_;
        if (EVar3 != Success) {
          ::std::__cxx11::string::string
                    ((string *)&local_3f0,
                     "Failed to download extension \"%s\" at URL \"%s%s\"\n%s (ERROR %s)",
                     (allocator *)(auStack_448 + 0xf));
          ::std::__cxx11::string::string((string *)&local_150,(string *)local_421._1_8_);
          ::std::__cxx11::string::string((string *)&local_170,(string *)&url_base);
          ::std::__cxx11::string::string((string *)&local_190,(string *)&url_local_part);
          ::std::__cxx11::string::string((string *)&local_1b0,(string *)&info);
          duckdb_httplib::to_string_abi_cxx11_(&local_90,(duckdb_httplib *)(ulong)res.err_,error);
          IOException::
          IOException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    ((IOException *)this_00,&local_3f0,&local_150,&local_170,&local_190,&local_1b0,
                     &local_90);
          __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error,0x40f9cc);
        }
        ::std::__cxx11::string::string
                  ((string *)&local_3f0,
                   "Failed to download extension \"%s\" at URL \"%s%s\" (HTTP %n)\n%s",
                   (allocator *)(auStack_448 + 0xf));
        ::std::__cxx11::string::string((string *)&local_f0,(string *)local_421._1_8_);
        ::std::__cxx11::string::string((string *)&local_110,(string *)&url_base);
        ::std::__cxx11::string::string((string *)&local_130,(string *)&url_local_part);
        iVar5 = *(int *)((long)res.res_._M_t.
                               super___uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
                               .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>.
                               _M_head_impl + 0x20);
        ::std::__cxx11::string::string(local_70,(string *)&info);
        params_4._8_16_ = auStack_448;
        params_4._M_dataplus._M_p = (pointer)local_70;
        params_4.field_2._8_8_ =
             install_info.
             super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
             .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl;
        HTTPException::
        HTTPException<duckdb_httplib::Response,_0,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  (this_00,(Response *)
                           uVar2._M_t.
                           super___uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
                           .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>._M_head_impl,
                   &local_3f0,&local_f0,&local_110,&local_130,iVar5,params_4);
        __cxa_throw(this_00,&HTTPException::typeinfo,::std::runtime_error::~runtime_error,local_70);
      }
      uVar14 = uVar14 + 1;
      dVar16 = exp2((double)(long)uVar14 + -1.0 + (double)(long)uVar14 + -1.0);
      uVar13 = (ulong)(dVar16 * 100.0);
      info._0_8_ = (long)(dVar16 * 100.0 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f | uVar13;
      ::std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&info);
      iVar5 = 0;
    }
    else {
      if ((__uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>
          )res.res_._M_t.
           super___uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
           .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>
          )0x0) {
LAB_0040f466:
        _Var12._M_t.
        super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
        .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>._M_head_impl =
             (tuple<duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>)
             (_Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
              )0x0;
        goto LAB_0040f468;
      }
      if (*(int *)((long)res.res_._M_t.
                         super___uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
                         .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>._M_head_impl +
                  0x20) != 0x130) goto LAB_0040f454;
      *(unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
        *)this = install_info.
                 super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                 .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl;
      install_info.
      super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
      .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            )(__uniq_ptr_data<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true,_true>
              )0x0;
      iVar5 = 1;
    }
LAB_0040f502:
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&decompressed_body);
    if (local_430._M_head_impl != (ClientImpl *)0x0) {
      (*(local_430._M_head_impl)->_vptr_ClientImpl[1])();
    }
    if (iVar5 != 0) {
      if (iVar5 == 3) {
        GZipFileSystem::UncompressGZIPString
                  (&decompressed_body,
                   (string *)
                   ((long)res.res_._M_t.
                          super___uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
                          .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>._M_head_impl +
                   0x78));
        info.full_path._M_dataplus._M_p = (pointer)&info.full_path.field_2;
        info._0_8_ = info._0_8_ & 0xffffffffffffff00;
        info.full_path._M_string_length = 0;
        info.full_path.field_2._M_local_buf[0] = '\0';
        info.repository_url._M_dataplus._M_p = (pointer)&info.repository_url.field_2;
        info.repository_url._M_string_length = 0;
        info.repository_url.field_2._M_local_buf[0] = '\0';
        info.version._M_dataplus._M_p = (pointer)&info.version.field_2;
        info.version._M_string_length = 0;
        info.version.field_2._M_local_buf[0] = '\0';
        info.etag._M_dataplus._M_p = (pointer)&info.etag.field_2;
        info.etag._M_string_length = 0;
        info.etag.field_2._M_local_buf[0] = '\0';
        CheckExtensionMetadataOnInstall
                  (db,decompressed_body._M_dataplus._M_p,decompressed_body._M_string_length,&info,
                   (string *)local_421._1_8_);
        uVar2 = res.res_;
        ::std::__cxx11::string::string((string *)&documentation_link,"ETag",(allocator *)&local_3f0)
        ;
        bVar4 = duckdb_httplib::Response::has_header
                          ((Response *)
                           uVar2._M_t.
                           super___uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
                           .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>._M_head_impl,
                           &documentation_link);
        ::std::__cxx11::string::~string((string *)&documentation_link);
        uVar2 = res.res_;
        if (bVar4) {
          ::std::__cxx11::string::string((string *)&local_3f0,"ETag",(allocator *)&local_430);
          duckdb_httplib::Response::get_header_value
                    (&documentation_link,
                     (Response *)
                     uVar2._M_t.
                     super___uniq_ptr_impl<duckdb_httplib::Response,_std::default_delete<duckdb_httplib::Response>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb_httplib::Response_*,_std::default_delete<duckdb_httplib::Response>_>
                     .super__Head_base<0UL,_duckdb_httplib::Response_*,_false>._M_head_impl,
                     &local_3f0,0);
          ::std::__cxx11::string::operator=((string *)&info.etag,(string *)&documentation_link);
          ::std::__cxx11::string::~string((string *)&documentation_link);
          ::std::__cxx11::string::~string((string *)&local_3f0);
        }
        psVar15 = (string *)&info.full_path;
        if ((options->repository).ptr == (ExtensionRepository *)0x0) {
          info.mode = CUSTOM_PATH;
        }
        else {
          info.mode = REPOSITORY;
          ::std::__cxx11::string::_M_assign(psVar15);
          optional_ptr<duckdb::ExtensionRepository,_true>::operator->(&options->repository);
          psVar15 = (string *)&info.repository_url;
        }
        ::std::__cxx11::string::_M_assign(psVar15);
        FileSystem::CreateLocal();
        pFVar9 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
                 operator*((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                            *)&documentation_link);
        WriteExtensionFiles(pFVar9,temp_path,param_5,decompressed_body._M_dataplus._M_p,
                            decompressed_body._M_string_length,&info);
        make_uniq<duckdb::ExtensionInstallInfo,duckdb::ExtensionInstallInfo&>(this,&info);
        if (documentation_link._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)documentation_link._M_dataplus._M_p + 8))();
        }
        ExtensionInstallInfo::~ExtensionInstallInfo(&info);
        ::std::__cxx11::string::~string((string *)&decompressed_body);
      }
      duckdb_httplib::Result::~Result(&res);
      ::std::__cxx11::string::~string((string *)&url_base);
      ::std::
      unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>::
      ~unique_ptr(&install_info.
                   super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                 );
      ::std::__cxx11::string::~string((string *)&url_local_part);
      ::std::__cxx11::string::~string((string *)&hostname_without_http);
      ::std::__cxx11::string::~string((string *)&no_http);
      return (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
              )(unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                )this;
    }
  } while( true );
}

Assistant:

static unique_ptr<ExtensionInstallInfo> InstallFromHttpUrl(DatabaseInstance &db, const string &url,
                                                           const string &extension_name, const string &temp_path,
                                                           const string &local_extension_path,
                                                           ExtensionInstallOptions &options,
                                                           optional_ptr<HTTPLogger> http_logger) {
	string no_http = StringUtil::Replace(url, "http://", "");

	idx_t next = no_http.find('/', 0);
	if (next == string::npos) {
		throw IOException("No slash in URL template");
	}

	// Push the substring [last, next) on to splits
	auto hostname_without_http = no_http.substr(0, next);
	auto url_local_part = no_http.substr(next);

	unique_ptr<ExtensionInstallInfo> install_info;
	{
		auto fs = FileSystem::CreateLocal();
		if (fs->FileExists(local_extension_path + ".info")) {
			try {
				install_info =
				    ExtensionInstallInfo::TryReadInfoFile(*fs, local_extension_path + ".info", extension_name);
			} catch (...) {
				if (!options.force_install) {
					// We are going to rewrite the file anyhow, so this is fine
					throw;
				}
			}
		}
	}

	auto url_base = "http://" + hostname_without_http;
	// FIXME: the retry logic should be unified with the retry logic in the httpfs client
	static constexpr idx_t MAX_RETRY_COUNT = 3;
	static constexpr uint64_t RETRY_WAIT_MS = 100;
	static constexpr double RETRY_BACKOFF = 4;
	idx_t retry_count = 0;
	duckdb_httplib::Result res;
	while (true) {
		duckdb_httplib::Client cli(url_base.c_str());
		if (!db.config.options.http_proxy.empty()) {
			idx_t port;
			string host;
			HTTPUtil::ParseHTTPProxyHost(db.config.options.http_proxy, host, port);
			cli.set_proxy(host, NumericCast<int>(port));
		}

		if (!db.config.options.http_proxy_username.empty() || !db.config.options.http_proxy_password.empty()) {
			cli.set_proxy_basic_auth(db.config.options.http_proxy_username, db.config.options.http_proxy_password);
		}

		if (http_logger) {
			cli.set_logger(http_logger->GetLogger<duckdb_httplib::Request, duckdb_httplib::Response>());
		}

		duckdb_httplib::Headers headers = {
		    {"User-Agent", StringUtil::Format("%s %s", db.config.UserAgent(), DuckDB::SourceID())}};

		if (options.use_etags && install_info && !install_info->etag.empty()) {
			headers.insert({"If-None-Match", StringUtil::Format("%s", install_info->etag)});
		}

		res = cli.Get(url_local_part.c_str(), headers);
		if (install_info && res && res->status == 304) {
			return install_info;
		}

		if (res && res->status == 200) {
			// success!
			break;
		}
		// failure - check if we should retry
		bool should_retry = false;
		if (res.error() == duckdb_httplib::Error::Success) {
			switch (res->status) {
			case 408: // Request Timeout
			case 418: // Server is pretending to be a teapot
			case 429: // Rate limiter hit
			case 500: // Server has error
			case 503: // Server has error
			case 504: // Server has error
				should_retry = true;
				break;
			default:
				break;
			}
		} else {
			// always retry on duckdb_httplib::Error::Error
			should_retry = true;
		}
		retry_count++;
		if (!should_retry || retry_count >= MAX_RETRY_COUNT) {
			// if we should not retry or exceeded the number of retries - bubble up the error
			string message;
			ExtensionHelper::CreateSuggestions(extension_name, message);

			auto documentation_link = ExtensionHelper::ExtensionInstallDocumentationLink(extension_name);
			if (!documentation_link.empty()) {
				message += "\nFor more info, visit " + documentation_link;
			}
			if (res.error() == duckdb_httplib::Error::Success) {
				throw HTTPException(res.value(), "Failed to download extension \"%s\" at URL \"%s%s\" (HTTP %n)\n%s",
				                    extension_name, url_base, url_local_part, res->status, message);
			} else {
				throw IOException("Failed to download extension \"%s\" at URL \"%s%s\"\n%s (ERROR %s)", extension_name,
				                  url_base, url_local_part, message, to_string(res.error()));
			}
		}
#ifndef DUCKDB_NO_THREADS
		// retry
		// sleep first
		uint64_t sleep_amount = static_cast<uint64_t>(static_cast<double>(RETRY_WAIT_MS) *
		                                              pow(RETRY_BACKOFF, static_cast<double>(retry_count) - 1));
		std::this_thread::sleep_for(std::chrono::milliseconds(sleep_amount));
#endif
	}
	auto decompressed_body = GZipFileSystem::UncompressGZIPString(res->body);

	ExtensionInstallInfo info;
	CheckExtensionMetadataOnInstall(db, (void *)decompressed_body.data(), decompressed_body.size(), info,
	                                extension_name);
	if (res->has_header("ETag")) {
		info.etag = res->get_header_value("ETag");
	}

	if (options.repository) {
		info.mode = ExtensionInstallMode::REPOSITORY;
		info.full_path = url;
		info.repository_url = options.repository->path;
	} else {
		info.mode = ExtensionInstallMode::CUSTOM_PATH;
		info.full_path = url;
	}

	auto fs = FileSystem::CreateLocal();
	WriteExtensionFiles(*fs, temp_path, local_extension_path, (void *)decompressed_body.data(),
	                    decompressed_body.size(), info);

	return make_uniq<ExtensionInstallInfo>(info);
}